

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsPublicationPublishComplex(HelicsPublication pub,double real,double imag,HelicsError *err)

{
  HelicsPublication pvVar1;
  undefined8 in_RDX;
  bool bVar2;
  complex<double> val;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (pub == (HelicsPublication)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a875b;
    }
    else {
      bVar2 = *pub == -0x684eff5b;
      pvVar1 = (HelicsPublication)0x0;
      if (bVar2) {
        pvVar1 = pub;
      }
      in_RDX = CONCAT71((int7)((ulong)in_RDX >> 8),bVar2 || err == (HelicsError *)0x0);
      if (bVar2 || err == (HelicsError *)0x0) goto LAB_001a875d;
    }
    err->error_code = -3;
    err->message = "The given publication object does not point to a valid object";
  }
LAB_001a875b:
  pvVar1 = (HelicsPublication)0x0;
LAB_001a875d:
  if (pvVar1 != (HelicsPublication)0x0) {
    val._M_value._8_8_ = in_RDX;
    val._M_value._0_8_ = err;
    helics::Publication::publish(*(Publication **)((long)pvVar1 + 0x18),val);
  }
  return;
}

Assistant:

void helicsPublicationPublishComplex(HelicsPublication pub, double real, double imag, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->publish(std::complex<double>(real, imag));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}